

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::bb::(anonymous_namespace)::getAPIName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BufferBlock *block,
          BufferVar *var,TypeComponentVector *accessPath)

{
  StructType *this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  pointer pVVar4;
  VarType *this_01;
  StructMember *this_02;
  bool local_249;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  local_208;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  local_200;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  local_1f8;
  StructType *local_1f0;
  StructType *structPtr;
  VarTypeComponent *local_1e0;
  undefined1 local_1d8 [8];
  VarType curType;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  local_1b8;
  const_iterator pathComp;
  ostringstream local_1a0 [8];
  ostringstream name;
  TypeComponentVector *accessPath_local;
  BufferVar *var_local;
  BufferBlock *block_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar2 = BufferBlock::getInstanceName((BufferBlock *)this);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = BufferBlock::getBlockName((BufferBlock *)this);
    poVar3 = std::operator<<((ostream *)local_1a0,pcVar2);
    std::operator<<(poVar3,".");
  }
  pcVar2 = BufferVar::getName((BufferVar *)block);
  std::operator<<((ostream *)local_1a0,pcVar2);
  local_1b8._M_current =
       (VarTypeComponent *)
       std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::begin
                 ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)var);
  while( true ) {
    curType.m_data._8_8_ =
         std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::end
                   ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)var);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1b8,
                       (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                        *)((long)&curType.m_data + 8));
    if (!bVar1) break;
    pVVar4 = __gnu_cxx::
             __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
             ::operator->(&local_1b8);
    if (pVVar4->type == STRUCT_MEMBER) {
      this_01 = BufferVar::getType((BufferVar *)block);
      local_1e0 = (VarTypeComponent *)
                  std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::begin
                            ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                              *)var);
      structPtr = (StructType *)local_1b8._M_current;
      glu::
      getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                ((VarType *)local_1d8,(glu *)this_01,(VarType *)local_1e0,local_1b8,
                 (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                  )accessPath);
      local_1f0 = glu::VarType::getStructPtr((VarType *)local_1d8);
      poVar3 = std::operator<<((ostream *)local_1a0,".");
      this_00 = local_1f0;
      pVVar4 = __gnu_cxx::
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->(&local_1b8);
      this_02 = glu::StructType::getMember(this_00,pVVar4->index);
      pcVar2 = glu::StructMember::getName(this_02);
      std::operator<<(poVar3,pcVar2);
      glu::VarType::~VarType((VarType *)local_1d8);
    }
    else {
      pVVar4 = __gnu_cxx::
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->(&local_1b8);
      if (pVVar4->type == ARRAY_ELEMENT) {
        local_1f8._M_current =
             (VarTypeComponent *)
             std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::begin
                       ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)var
                       );
        bVar1 = __gnu_cxx::operator==(&local_1b8,&local_1f8);
        local_249 = true;
        if (!bVar1) {
          local_200 = __gnu_cxx::
                      __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      ::operator+(&local_1b8,1);
          local_208._M_current =
               (VarTypeComponent *)
               std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::end
                         ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                          var);
          local_249 = __gnu_cxx::operator==(&local_200,&local_208);
        }
        if (local_249 == false) {
          poVar3 = std::operator<<((ostream *)local_1a0,"[");
          pVVar4 = __gnu_cxx::
                   __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                   ::operator->(&local_1b8);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,pVVar4->index);
          std::operator<<(poVar3,"]");
        }
        else {
          std::operator<<((ostream *)local_1a0,"[0]");
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
    ::operator++(&local_1b8,0);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string getAPIName (const BufferBlock& block, const BufferVar& var, const glu::TypeComponentVector& accessPath)
{
	std::ostringstream name;

	if (block.getInstanceName())
		name << block.getBlockName() << ".";

	name << var.getName();

	for (glu::TypeComponentVector::const_iterator pathComp = accessPath.begin(); pathComp != accessPath.end(); pathComp++)
	{
		if (pathComp->type == glu::VarTypeComponent::STRUCT_MEMBER)
		{
			const VarType		curType		= glu::getVarType(var.getType(), accessPath.begin(), pathComp);
			const StructType*	structPtr	= curType.getStructPtr();

			name << "." << structPtr->getMember(pathComp->index).getName();
		}
		else if (pathComp->type == glu::VarTypeComponent::ARRAY_ELEMENT)
		{
			if (pathComp == accessPath.begin() || (pathComp+1) == accessPath.end())
				name << "[0]"; // Top- / bottom-level array
			else
				name << "[" << pathComp->index << "]";
		}
		else
			DE_ASSERT(false);
	}

	return name.str();
}